

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SynthStateMonitor.cpp
# Opt level: O0

void __thiscall PartVolumeButton::paintEvent(PartVolumeButton *this,QPaintEvent *param_1)

{
  byte bVar1;
  long *plVar2;
  QStyleOptionFocusRect local_c8 [8];
  QStyleOptionFocusRect opt;
  QSize local_78;
  QPixmap local_70 [28];
  QRect local_54;
  QIcon local_38 [8];
  QIcon icon;
  QStylePainter painter;
  QPaintEvent *param_1_local;
  PartVolumeButton *this_local;
  
  QStylePainter::QStylePainter((QStylePainter *)&icon,(QWidget *)this);
  plVar2 = (long *)QWidget::style();
  (**(code **)(*plVar2 + 0x100))(local_38,plVar2,0 < this->volume ^ 0x45,0);
  local_54 = QWidget::rect((QWidget *)this);
  local_78 = QWidget::size((QWidget *)this);
  QIcon::pixmap((QSize *)local_70,(Mode)local_38,(State)&local_78);
  QStylePainter::drawItemPixmap((QStylePainter *)&icon,&local_54,0x84,local_70);
  QPixmap::~QPixmap(local_70);
  bVar1 = QWidget::hasFocus();
  if ((bVar1 & 1) != 0) {
    QStyleOptionFocusRect::QStyleOptionFocusRect(local_c8);
    QStyleOption::initFrom((QWidget *)local_c8);
    QStylePainter::drawPrimitive((QStylePainter *)&icon,PE_FrameFocusRect,(QStyleOption *)local_c8);
    QStyleOptionFocusRect::~QStyleOptionFocusRect(local_c8);
  }
  QIcon::~QIcon(local_38);
  QStylePainter::~QStylePainter((QStylePainter *)&icon);
  return;
}

Assistant:

void PartVolumeButton::paintEvent(QPaintEvent*) {
	QStylePainter painter(this);
	QIcon icon = style()->standardIcon(volume > 0 ? QStyle::SP_MediaVolume : QStyle::SP_MediaVolumeMuted);
	painter.drawItemPixmap(rect(), Qt::AlignCenter, icon.pixmap(size()));
	if (hasFocus()) {
		QStyleOptionFocusRect opt;
		opt.initFrom(this);
		painter.drawPrimitive(QStyle::PE_FrameFocusRect, opt);
	}
}